

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NaNNPObj.cpp
# Opt level: O1

void __thiscall
NaNNPredictObjectUnit::NaNNPredictObjectUnit
          (NaNNPredictObjectUnit *this,uint nControlDim,uint nOutputDim)

{
  NaReal *pNVar1;
  undefined4 *puVar2;
  
  NaUnit::NaUnit(&this->super_NaUnit,1,1,0);
  (this->super_NaUnit).super_NaLogging._vptr_NaLogging = (_func_int **)&PTR_PrintLog_001748d8;
  this->nControlDepth = nControlDim;
  this->nObjectDepth = nOutputDim;
  if (nControlDim != 0) {
    pNVar1 = (NaReal *)operator_new__((ulong)(nOutputDim + nControlDim) << 3);
    this->pTotalInput = pNVar1;
    return;
  }
  puVar2 = (undefined4 *)__cxa_allocate_exception(4);
  *puVar2 = 3;
  __cxa_throw(puVar2,&NaException::typeinfo,0);
}

Assistant:

NaNNPredictObjectUnit::NaNNPredictObjectUnit (unsigned nControlDim,
                                              unsigned nOutputDim)
:   nControlDepth(nControlDim),
    nObjectDepth(nOutputDim),
    NaUnit(1/* inputs */, 1/* outputs */, 0/* feedback */)
{
    if(nControlDim < 1)
        // Must be > 0
        throw(na_bad_value);
    pTotalInput = new NaReal[nControlDepth + nObjectDepth];
}